

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sin.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  double dVar6;
  int tmp;
  int output_length;
  string local_1f8;
  allocator local_1d1;
  double local_1d0;
  double amplitude;
  double period;
  double local_1b8;
  ulong local_1b0;
  ostringstream error_message;
  
  output_length = -1;
  period = 10.0;
  amplitude = 1.0;
  local_1b0 = 0;
  do {
    iVar4 = ya_getopt_long(argc,argv,"l:m:p:a:o:h",(option *)0x0,(int *)0x0);
    switch(iVar4) {
    case 0x68:
      anon_unknown.dwarf_2102::PrintUsage((ostream *)&std::cout);
      return 0;
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6e:
switchD_001025a9_caseD_69:
      anon_unknown.dwarf_2102::PrintUsage((ostream *)&std::cerr);
      return 1;
    case 0x6c:
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&local_1f8);
      bVar3 = sptk::ConvertStringToInteger((string *)&error_message,&output_length);
      bVar2 = output_length < 1;
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar3 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -l option must be a positive integer");
        std::__cxx11::string::string((string *)&local_1f8,"sin",(allocator *)&tmp);
        sptk::PrintErrorMessage(&local_1f8,&error_message);
        goto LAB_00102a7c;
      }
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&local_1f8);
      bVar2 = sptk::ConvertStringToInteger((string *)&error_message,&output_length);
      bVar3 = output_length < 0;
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -m option must be a non-negative integer");
        std::__cxx11::string::string((string *)&local_1f8,"sin",(allocator *)&tmp);
        sptk::PrintErrorMessage(&local_1f8,&error_message);
        goto LAB_00102a7c;
      }
      output_length = output_length + 1;
      break;
    case 0x6f:
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&local_1f8);
      bVar2 = sptk::ConvertStringToInteger((string *)&error_message,&tmp);
      if (bVar2) {
        bVar2 = sptk::IsInRange(tmp,0,1);
        std::__cxx11::string::~string((string *)&error_message);
        if (bVar2) {
          local_1b0 = (ulong)(uint)tmp;
          break;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&error_message);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      poVar5 = std::operator<<((ostream *)&error_message,
                               "The argument for the -o option must be an integer ");
      poVar5 = std::operator<<(poVar5,"in the range of ");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0);
      poVar5 = std::operator<<(poVar5," to ");
      std::ostream::operator<<((ostream *)poVar5,1);
      std::__cxx11::string::string((string *)&local_1f8,"sin",&local_1d1);
      sptk::PrintErrorMessage(&local_1f8,&error_message);
      goto LAB_00102a7c;
    case 0x70:
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&local_1f8);
      bVar3 = sptk::ConvertStringToDouble((string *)&error_message,&period);
      bVar2 = period <= 0.0;
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar3 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "The argument for the -p option must be a positive number");
        std::__cxx11::string::string((string *)&local_1f8,"sin",(allocator *)&tmp);
        sptk::PrintErrorMessage(&local_1f8,&error_message);
        goto LAB_00102a7c;
      }
      break;
    default:
      if (iVar4 != 0x61) {
        if (iVar4 != -1) goto switchD_001025a9_caseD_69;
        if (ya_optind == argc) {
          bVar2 = sptk::SetBinaryMode();
          uVar1 = local_1b0;
          if (bVar2) {
            local_1b8 = 6.283185307179586 / period;
            iVar4 = 0;
            do {
              if (output_length != -1 && output_length <= iVar4) {
                return 0;
              }
              if ((int)uVar1 == 1) {
                local_1d0 = amplitude;
                dVar6 = cos((double)iVar4 * local_1b8);
              }
              else {
                if ((int)uVar1 != 0) {
                  return 1;
                }
                local_1d0 = amplitude;
                dVar6 = sin((double)iVar4 * local_1b8);
              }
              bVar2 = sptk::WriteStream<double>(dVar6 * local_1d0,(ostream *)&std::cout);
              iVar4 = iVar4 + 1;
            } while (bVar2);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            std::operator<<((ostream *)&error_message,"Failed to write sinusoidal sequence");
            std::__cxx11::string::string((string *)&local_1f8,"sin",(allocator *)&tmp);
            sptk::PrintErrorMessage(&local_1f8,&error_message);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
            std::operator<<((ostream *)&error_message,"Cannot set translation mode");
            std::__cxx11::string::string((string *)&local_1f8,"sin",(allocator *)&tmp);
            sptk::PrintErrorMessage(&local_1f8,&error_message);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
          std::operator<<((ostream *)&error_message,"Input file is not required");
          std::__cxx11::string::string((string *)&local_1f8,"sin",(allocator *)&tmp);
          sptk::PrintErrorMessage(&local_1f8,&error_message);
        }
        goto LAB_00102a7c;
      }
      std::__cxx11::string::string((string *)&error_message,ya_optarg,(allocator *)&local_1f8);
      bVar2 = sptk::ConvertStringToDouble((string *)&error_message,&amplitude);
      std::__cxx11::string::~string((string *)&error_message);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,"The argument for the -a option must be numeric");
        std::__cxx11::string::string((string *)&local_1f8,"sin",(allocator *)&tmp);
        sptk::PrintErrorMessage(&local_1f8,&error_message);
LAB_00102a7c:
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
        return 1;
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  int output_length(kMagicNumberForInfinity);
  double period(kDefaultPeriod);
  double amplitude(kDefaultAmplitude);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:p:a:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &output_length) ||
            output_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                           "non-negative integer";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        ++output_length;
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToDouble(optarg, &period) || period <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive number";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &amplitude)) {
          std::ostringstream error_message;
          error_message << "The argument for the -a option must be numeric";
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("sin", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (0 != argc - optind) {
    std::ostringstream error_message;
    error_message << "Input file is not required";
    sptk::PrintErrorMessage("sin", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("sin", error_message);
    return 1;
  }

  const double omega(sptk::kTwoPi / period);
  for (int i(0); kMagicNumberForInfinity == output_length || i < output_length;
       ++i) {
    double output;
    switch (output_format) {
      case kSine: {
        output = amplitude * std::sin(omega * i);
        break;
      }
      case kCosine: {
        output = amplitude * std::cos(omega * i);
        break;
      }
      default: {
        return 1;
      }
    }
    if (!sptk::WriteStream(output, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write sinusoidal sequence";
      sptk::PrintErrorMessage("sin", error_message);
      return 1;
    }
  }

  return 0;
}